

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

TypeCast * __thiscall soul::heart::Parser::parseCast(Parser *this,FunctionParseState *state)

{
  Expression *args_1;
  Module *this_00;
  TypeCast *pTVar1;
  Expression *source;
  undefined1 local_40 [8];
  Type destType;
  CodeLocation pos;
  FunctionParseState *state_local;
  Parser *this_local;
  
  CodeLocation::CodeLocation
            ((CodeLocation *)&destType.structure,
             &(this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ).location);
  readValueType((Type *)local_40,this);
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x573c42);
  args_1 = parseExpression(this,state);
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x571824);
  this_00 = pool_ptr<soul::Module>::operator->(&this->module);
  pTVar1 = Module::
           allocate<soul::heart::TypeCast,soul::CodeLocation&,soul::heart::Expression&,soul::Type&>
                     (this_00,(CodeLocation *)&destType.structure,args_1,(Type *)local_40);
  Type::~Type((Type *)local_40);
  CodeLocation::~CodeLocation((CodeLocation *)&destType.structure);
  return pTVar1;
}

Assistant:

heart::TypeCast& parseCast (const FunctionParseState& state)
    {
        auto pos = location;
        auto destType = readValueType();
        expect (HEARTOperator::openParen);
        auto& source = parseExpression (state);
        expect (HEARTOperator::closeParen);

        return module->allocate<heart::TypeCast> (pos, source, destType);
    }